

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.cpp
# Opt level: O3

int main(void)

{
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  *this;
  _func_int **pp_Var1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  rt_expression_interface<double> *prVar5;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar6;
  pointer prVar7;
  pointer prVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  void *__child_stack;
  __fn *in_RSI;
  void *in_R8;
  ct_constant<8L> c8;
  expr substi1;
  vector_expr vec2;
  expr vec_expr;
  expr substi2;
  expr uv;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  vector_expr vec;
  vector_expr vec3;
  expr x_pow_4;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  variable z;
  function_symbol v;
  variable x;
  ct_constant<8L> local_141;
  undefined1 local_140 [16];
  auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_> local_130;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_128;
  undefined1 local_120 [16];
  auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_> local_110;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_108;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_100;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_f8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_f0;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> local_e8;
  undefined1 local_d8 [16];
  auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_> local_c8;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_c0;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_b8;
  rt_expr<viennamath::rt_expression_interface<double>_> local_98;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> local_90;
  rt_variable<viennamath::rt_expression_interface<double>_> local_80;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> local_70;
  undefined **local_58;
  undefined8 local_50;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> local_48;
  
  local_58 = &PTR__rt_expression_interface_00116860;
  local_50 = 0;
  local_80.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00116860;
  local_80.id_ = 2;
  local_90.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001167a0;
  local_90.s = 4.0;
  local_e8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00116960;
  local_e8.s = 6;
  iVar3 = 0x116a20;
  local_48.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00116a20;
  local_48.id_ = 0;
  local_48.tag_id_ = 0;
  local_70.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00116a20;
  local_70.id_ = 0;
  local_70.tag_id_ = 1;
  prVar5 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar5->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00116860;
  prVar5[1]._vptr_rt_expression_interface = (_func_int **)0x0;
  poVar6 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar6->_vptr_op_interface = (_func_int **)&PTR__op_interface_00116b20;
  local_108._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_108._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00116860;
  local_108._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x0;
  local_120._0_8_ = &PTR__rt_binary_expr_00116490;
  local_120._8_8_ = prVar5;
  local_110._M_ptr = poVar6;
  prVar7 = (pointer)operator_new(0x10);
  (prVar7->rt_expr_)._M_ptr =
       (rt_expression_interface<double> *)&PTR__rt_expression_interface_00116860;
  prVar7[1].rt_expr_._M_ptr = (rt_expression_interface<double> *)0x0;
  prVar8 = (pointer)operator_new(8);
  (prVar8->rt_expr_)._M_ptr = (rt_expression_interface<double> *)&PTR__op_interface_00116b20;
  local_b8.
  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  .
  super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new(0x10);
  ((local_b8.
    super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
    .
    super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage)->rt_expr_)._M_ptr =
       (rt_expression_interface<double> *)&PTR__rt_expression_interface_00116860;
  local_b8.
  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  .
  super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].rt_expr_._M_ptr =
       (rt_expression_interface<double> *)0x0;
  local_b8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00116490;
  local_b8.
  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  .
  super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = prVar7;
  local_b8.
  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  .
  super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = prVar8;
  iVar3 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)local_120,
                     in_RSI,__child_stack,iVar3,in_R8);
  poVar6 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar6->_vptr_op_interface = (_func_int **)&PTR__op_interface_00116b20;
  iVar4 = (*local_b8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_c0._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar4);
  local_d8._0_8_ = &PTR__rt_binary_expr_00116490;
  local_d8._8_8_ = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar3);
  local_c8._M_ptr = poVar6;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&local_98,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)local_d8);
  local_d8._0_8_ = &PTR__rt_binary_expr_00116490;
  if (local_c0._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c0._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_c8._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_c8._M_ptr)->_vptr_op_interface[1])();
  }
  if ((rt_expression_interface<double> *)local_d8._8_8_ != (rt_expression_interface<double> *)0x0) {
    (*(*(_func_int ***)local_d8._8_8_)[1])();
  }
  local_b8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00116490;
  if (local_b8.
      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      .
      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)((local_b8.
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                .
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->rt_expr_)._M_ptr[1].
              _vptr_rt_expression_interface)();
  }
  if (local_b8.
      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      .
      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)((local_b8.
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                .
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->rt_expr_)._M_ptr[1].
              _vptr_rt_expression_interface)();
  }
  if (local_b8.
      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      .
      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)((local_b8.
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                .
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->rt_expr_)._M_ptr[1].
              _vptr_rt_expression_interface)();
  }
  local_120._0_8_ = &PTR__rt_binary_expr_00116490;
  if (local_108._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_108._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_110._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_110._M_ptr)->_vptr_op_interface[1])();
  }
  if ((rt_expression_interface<double> *)local_120._8_8_ != (rt_expression_interface<double> *)0x0)
  {
    (*(*(_func_int ***)local_120._8_8_)[1])();
  }
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_d8,3);
  uVar2 = local_d8._8_8_;
  pp_Var9 = (_func_int **)(*(code *)local_58[2])();
  pp_Var1 = *(_func_int ***)uVar2;
  if (pp_Var1 != pp_Var9) {
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
    }
    *(_func_int ***)uVar2 = pp_Var9;
  }
  this = (vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
          *)(local_120 + 8);
  local_120._0_8_ = &PTR__rt_expression_interface_00116560;
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::vector(this,(vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 *)(local_d8 + 8));
  uVar2 = local_d8._8_8_;
  local_120._0_8_ = &PTR__rt_vector_expr_00116608;
  iVar3 = (*local_e8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  pp_Var1 = ((rt_expression_interface<double> *)(uVar2 + 8))->_vptr_rt_expression_interface;
  if (pp_Var1 != (_func_int **)CONCAT44(extraout_var_01,iVar3)) {
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
    }
    ((rt_expression_interface<double> *)(uVar2 + 8))->_vptr_rt_expression_interface =
         (_func_int **)CONCAT44(extraout_var_01,iVar3);
  }
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (&local_b8,(long)local_110._M_ptr - local_120._8_8_ >> 3);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::operator=(&local_b8.
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ,this);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)(local_120._8_8_ + 8),
             &local_141);
  uVar2 = local_120._8_8_;
  iVar3 = (*local_e8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  pp_Var1 = ((rt_expression_interface<double> *)(uVar2 + 0x10))->_vptr_rt_expression_interface;
  if (pp_Var1 != (_func_int **)CONCAT44(extraout_var_02,iVar3)) {
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
    }
    ((rt_expression_interface<double> *)(uVar2 + 0x10))->_vptr_rt_expression_interface =
         (_func_int **)CONCAT44(extraout_var_02,iVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec: ",5);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_d8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2: ",6);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec3: ",6);
  poVar10 = viennamath::operator<<((ostream *)&std::cout,&local_b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------------------",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec + vec2: ",0xc);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator+
            ((self_type *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_d8,
             (self_type *)local_120);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec - vec2: ",0xc);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator-
            ((self_type *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_d8,
             (self_type *)local_120);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z * vec2: ",10);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,&local_80,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2 * z: ",10);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120,&local_80);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c4 * vec2: ",0xb);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,&local_90,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2 * c4: ",0xb);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120,&local_90);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c6 * vec2: ",0xb);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,&local_e8,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2 * c6: ",0xb);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120,&local_e8);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c6 * vec2: ",0xb);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,&local_141,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2 * c6: ",0xb);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120,&local_141);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c6 / vec2: ",0xb);
  viennamath::operator/
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,&local_e8,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2 / z: ",10);
  viennamath::operator/
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_120,&local_e8);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_140 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------------------",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec * vec2: ",0xc);
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_140,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_d8);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((_func_int **)local_140._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_140._0_8_ + 8))();
  }
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec as expr: ",0xd);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  iVar3 = (*local_48.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar6 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  ((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)&poVar6->_vptr_op_interface)->
  _M_ptr = (rt_expression_interface<double> *)&PTR__op_interface_00116b20;
  iVar4 = (*local_70.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_128._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar4);
  local_140._0_8_ = &PTR__rt_binary_expr_00116490;
  local_140._8_8_ = (rt_expression_interface<double> *)CONCAT44(extraout_var_03,iVar3);
  local_130._M_ptr = poVar6;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_f0,
             (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  local_140._0_8_ = &PTR__rt_binary_expr_00116490;
  if (local_128._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(code *)((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)
              &(local_128._M_ptr)->_vptr_rt_expression_interface)->_M_ptr[1].
              _vptr_rt_expression_interface)();
  }
  if (local_130._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(code *)((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)
              &(local_130._M_ptr)->_vptr_op_interface)->_M_ptr[1]._vptr_rt_expression_interface)();
  }
  if ((rt_expression_interface<double> *)local_140._8_8_ != (rt_expression_interface<double> *)0x0)
  {
    (*(code *)((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)local_140._8_8_)->
              _M_ptr[1]._vptr_rt_expression_interface)();
  }
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)local_140,&local_48,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_f0);
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&local_f8,&local_70,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Substituted 1: ",0xf);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_expr<viennamath::rt_expression_interface<double>_> *)local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Substituted 2: ",0xf);
  poVar10 = viennamath::operator<<
                      ((ostream *)&std::cout,
                       (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"****************************************************",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"****************************************************",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (local_f8._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_f8._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if ((_func_int **)local_140._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_140._0_8_ + 8))();
  }
  if (local_f0._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_f0._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_100._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_100._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_b8.
             super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           );
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(this);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             *)(local_d8 + 8));
  if (local_98.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(*(_func_int ***)local_98.rt_expr_._M_ptr)[1])();
  }
  return 0;
}

Assistant:

int main()
{
  viennamath::variable x(0);
  viennamath::variable y(1);
  viennamath::variable z(2);
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;
  viennamath::function_symbol u(0, viennamath::unknown_tag<>());
  viennamath::function_symbol v(0, viennamath::test_tag<>());
  viennamath::expr x_pow_4 = (x*x)*(x*x);

  viennamath::vector_expr  vec(3);
  vec[0] = x;
  //vec[1] = c6;             //uncomment this is you do not want to have the default constant '0' here
  //vec[2] = x*y + z - c6;   //uncomment this is you do not want to have the default constant '0' here

  viennamath::vector_expr  vec2(vec);
  vec[1] = c6;

  viennamath::vector_expr  vec3(vec2.size());
  vec3 = vec2;
  vec2[1] = c8;
  vec2[2] = c6;

  std::cout << "vec: " << vec << std::endl;
  std::cout << "vec2: " << vec2 << std::endl;
  std::cout << "vec3: " << vec3 << std::endl;
  std::cout << "----------------------" << std::endl;
  std::cout << "vec + vec2: " << vec + vec2 << std::endl;
  std::cout << "vec - vec2: " << vec - vec2 << std::endl;

  // check multiplication:
  std::cout << "z * vec2: "   << z * vec2   << std::endl;
  std::cout << "vec2 * z: "   << vec2 * z   << std::endl;

  std::cout << "c4 * vec2: "   << c4 * vec2   << std::endl;
  std::cout << "vec2 * c4: "   << vec2 * c4   << std::endl;

  std::cout << "c6 * vec2: "   << c6 * vec2   << std::endl;
  std::cout << "vec2 * c6: "   << vec2 * c6   << std::endl;

  std::cout << "c6 * vec2: "   << c8 * vec2   << std::endl;
  std::cout << "vec2 * c6: "   << vec2 * c8   << std::endl;

  // check division:
  std::cout << "c6 / vec2: "  << c6 / vec2  << std::endl;
  std::cout << "vec2 / z: "   << vec2 / c6  << std::endl;


  std::cout << "----------------------" << std::endl;
  std::cout << "vec * vec2: "   << vec * vec2  << std::endl;

  viennamath::expr vec_expr = vec;
  std::cout << "vec as expr: " << vec_expr << std::endl;


  viennamath::expr uv = u*v;
  viennamath::expr substi1 = viennamath::substitute(u, vec_expr, uv);
  viennamath::expr substi2 = viennamath::substitute(v, vec_expr, substi1);
  std::cout << "Substituted 1: " << substi1 << std::endl;
  std::cout << "Substituted 2: " << substi2 << std::endl;


  std::cout << "****************************************************" << std::endl;
  std::cout << "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "****************************************************" << std::endl;

  return EXIT_SUCCESS;
}